

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.cpp
# Opt level: O2

string * __thiscall Screen::getInput_abi_cxx11_(string *__return_storage_ptr__,Screen *this)

{
  allocator local_99;
  string local_98 [32];
  char inputText [100];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  inputText[0] = '\0';
  wclear(this->inputScreen);
  wrefresh(this->inputScreen);
  mvwprintw(this->inputScreen,1,1,"> ");
  wgetnstr(this->inputScreen,inputText,0xffffffffffffffff);
  std::__cxx11::string::string(local_98,inputText,&local_99);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_98);
  std::__cxx11::string::~string(local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string Screen::getInput() {
    std::string formattedInput;
    char inputText[MAX_INPUT_LENGTH];
    inputText[0] = '\0';

    // Clear the input area
    clearWindow(inputScreen);
    wrefresh(inputScreen);

    // Move the cursor to the correct location
    mvwprintw(inputScreen, 1, 1, "> ");

    // Get a string of console input
    wgetstr(inputScreen, inputText);

    formattedInput = std::string(inputText);

    return formattedInput;
}